

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * GetFileExtension(string *__return_storage_ptr__,string *fileName)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)fileName,0x107159,0xffffffffffffffff);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::find_last_of((char *)fileName,0x107159,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)fileName);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetFileExtension(const string& fileName)
{
    if(fileName.find_last_of(".") != std::string::npos)
        return fileName.substr(fileName.find_last_of(".")+1);
    return "";
}